

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O2

bool __thiscall
WorldShuffler::test_item_source_compatibility(WorldShuffler *this,ItemSource *source,Item *item)

{
  ItemSource *this_00;
  bool bVar1;
  WorldNode *pWVar2;
  bool bVar3;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *__range2;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> sources_in_node;
  _Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_> local_48;
  
  bVar1 = ItemSource::is_chest(source);
  bVar3 = true;
  if ((!bVar1) && (bVar1 = ItemSource::is_npc_reward(source), !bVar1)) {
    if (item->_id < 0x40) {
      bVar1 = ItemSource::is_shop_item(source);
      if (!bVar1) {
        return true;
      }
      if (item->_id != '?') {
        pWVar2 = RandomizerWorld::node(this->_world,&source->_node_id);
        std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::vector
                  ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&local_48,
                   &pWVar2->_item_sources);
        while( true ) {
          if (local_48._M_impl.super__Vector_impl_data._M_start ==
              local_48._M_impl.super__Vector_impl_data._M_finish) {
            std::_Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>::~_Vector_base(&local_48)
            ;
            return true;
          }
          this_00 = *local_48._M_impl.super__Vector_impl_data._M_start;
          if (((this_00 != source) && (bVar1 = ItemSource::is_shop_item(this_00), bVar1)) &&
             (this_00->_item == item)) break;
          local_48._M_impl.super__Vector_impl_data._M_start =
               local_48._M_impl.super__Vector_impl_data._M_start + 1;
        }
        std::_Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>::~_Vector_base(&local_48);
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool WorldShuffler::test_item_source_compatibility(ItemSource* source, Item* item) const
{
    if(source->is_chest() || source->is_npc_reward())
        return true;

    ItemSourceOnGround* cast_source = reinterpret_cast<ItemSourceOnGround*>(source);
    if(item->id() >= ITEM_GOLDS_START)
        return false;

    if(source->is_shop_item())
    {
        if(item->id() == ITEM_NONE)
            return false;

        // If another shop source in the same node contains the same item, deny item placement
        WorldNode* shop_node = _world.node(source->node_id());
        const std::vector<ItemSource*> sources_in_node = shop_node->item_sources();
        for(ItemSource* source_in_node : sources_in_node)
            if(source_in_node != source && source_in_node->is_shop_item() && source_in_node->item() == item)
                return false;
    }

    return true;
}